

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::Clear(ImDrawData *this)

{
  int iVar1;
  ImDrawList **__src;
  ImDrawList **__dest;
  uint uVar2;
  ulong uVar3;
  
  this->Valid = false;
  this->TotalVtxCount = 0;
  this->CmdListsCount = 0;
  this->TotalIdxCount = 0;
  iVar1 = (this->CmdLists).Capacity;
  if (iVar1 < 0) {
    uVar2 = iVar1 / 2 + iVar1;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    __dest = (ImDrawList **)ImGui::MemAlloc(uVar3 * 8);
    __src = (this->CmdLists).Data;
    if (__src != (ImDrawList **)0x0) {
      memcpy(__dest,__src,(long)(this->CmdLists).Size << 3);
      ImGui::MemFree((this->CmdLists).Data);
    }
    (this->CmdLists).Data = __dest;
    (this->CmdLists).Capacity = (int)uVar3;
  }
  (this->CmdLists).Size = 0;
  (this->DisplayPos).x = 0.0;
  (this->DisplayPos).y = 0.0;
  (this->DisplaySize).x = 0.0;
  (this->DisplaySize).y = 0.0;
  (this->FramebufferScale).x = 0.0;
  (this->FramebufferScale).y = 0.0;
  this->OwnerViewport = (ImGuiViewport *)0x0;
  return;
}

Assistant:

void ImDrawData::Clear()
{
    Valid = false;
    CmdListsCount = TotalIdxCount = TotalVtxCount = 0;
    CmdLists.resize(0); // The ImDrawList are NOT owned by ImDrawData but e.g. by ImGuiContext, so we don't clear them.
    DisplayPos = DisplaySize = FramebufferScale = ImVec2(0.0f, 0.0f);
    OwnerViewport = NULL;
}